

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall gmath::OrthoCamera::OrthoCamera(OrthoCamera *this,Properties *prop)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  undefined8 *in_RDI;
  string origin;
  Vector3d T;
  int in_stack_000000a4;
  Properties *in_stack_000000a8;
  Camera *in_stack_000000b0;
  char *in_stack_000001c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000001d0;
  char *in_stack_000001d8;
  Properties *in_stack_000001e0;
  Vector3d *in_stack_ffffffffffffff68;
  Camera *in_stack_ffffffffffffff70;
  string local_58 [32];
  string local_38 [16];
  char *in_stack_ffffffffffffffd8;
  Properties *in_stack_ffffffffffffffe0;
  
  Camera::Camera(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4);
  *in_RDI = &PTR__OrthoCamera_001c5890;
  gutil::Properties::getValue<double>
            (in_stack_000001e0,in_stack_000001d8,(double *)in_stack_000001d0,in_stack_000001c8);
  gutil::Properties::getValue<double>
            (in_stack_000001e0,in_stack_000001d8,(double *)in_stack_000001d0,in_stack_000001c8);
  bVar2 = gutil::Properties::contains(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar2) {
    SVector<double,_3>::SVector((SVector<double,_3> *)(local_58 + 0x20));
    gutil::Properties::getValue<gmath::SVector<double,3>>
              (in_stack_000001e0,in_stack_000001d8,(SVector<double,_3> *)in_stack_000001d0,
               in_stack_000001c8);
    std::__cxx11::string::string(local_58);
    gutil::Properties::getValue<std::__cxx11::string>
              (in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    if (bVar2) {
      dVar1 = (double)in_RDI[0x18];
      pdVar3 = SVector<double,_3>::operator[]((SVector<double,_3> *)(local_58 + 0x20),0);
      *pdVar3 = *pdVar3 - dVar1 * 0.5;
      in_stack_ffffffffffffff68 = (Vector3d *)((double)in_RDI[0x18] * 0.5);
      in_stack_ffffffffffffff70 =
           (Camera *)SVector<double,_3>::operator[]((SVector<double,_3> *)(local_58 + 0x20),1);
      in_stack_ffffffffffffff70->_vptr_Camera =
           (_func_int **)
           ((double)in_stack_ffffffffffffff68 + (double)in_stack_ffffffffffffff70->_vptr_Camera);
    }
    Camera::setT(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(local_58);
  }
  return;
}

Assistant:

OrthoCamera::OrthoCamera(const gutil::Properties &prop)
  : Camera(prop, -1)
{
  prop.getValue("resolution", res);
  prop.getValue("depth.resolution", dres, "1");

  if (prop.contains("origin.T"))
  {
    Vector3d T;
    prop.getValue("origin.T", T);

    std::string origin;
    prop.getValue("origin", origin, "corner");

    if (origin == "center")
    {
      T[0]-=res/2;
      T[1]+=res/2;
    }

    setT(T);
  }
}